

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.hpp
# Opt level: O0

void ruckig::Block::remove_profile<6ul>
               (array<ruckig::Profile,_6UL> *valid_profiles,size_t *valid_profile_counter,
               size_t index)

{
  reference __src;
  reference __dest;
  undefined8 local_28;
  size_t i;
  size_t index_local;
  size_t *valid_profile_counter_local;
  array<ruckig::Profile,_6UL> *valid_profiles_local;
  
  for (local_28 = index; local_28 < *valid_profile_counter - 1; local_28 = local_28 + 1) {
    __src = std::array<ruckig::Profile,_6UL>::operator[](valid_profiles,local_28 + 1);
    __dest = std::array<ruckig::Profile,_6UL>::operator[](valid_profiles,local_28);
    memcpy(__dest,__src,0x23c);
  }
  *valid_profile_counter = *valid_profile_counter - 1;
  return;
}

Assistant:

inline static void remove_profile(std::array<Profile, N>& valid_profiles, size_t& valid_profile_counter, size_t index) {
        for (size_t i = index; i < valid_profile_counter - 1; ++i) {
            valid_profiles[i] = valid_profiles[i + 1];
        }
        valid_profile_counter -= 1;
    }